

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::calcRefCoords(RigidBody *this)

{
  pointer ppAVar1;
  bool bVar2;
  int i_2;
  int iVar3;
  Vector3<double> *v1;
  size_t i_1;
  long lVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  Vector3d evals;
  Mat3x3d Itmp;
  Vector3d refCOM;
  RectMatrix<double,_3U,_3U> local_1f8;
  RectMatrix<double,_3U,_3U> local_1b0;
  Vector<double,_3U> local_168;
  SquareMatrix3<double> local_150;
  SquareMatrix3<double> local_108;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_1f8.data_[0][0] = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1b0,(double *)&local_1f8);
  Vector<double,_3U>::Vector(&local_168,(Vector<double,_3U> *)&local_1b0);
  (this->super_StuntDouble).mass_ = 0.0;
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar5) break;
    dVar8 = (ppAVar1[uVar5]->super_StuntDouble).mass_;
    (this->super_StuntDouble).mass_ = (this->super_StuntDouble).mass_ + dVar8;
    operator*((Vector<double,_3U> *)&local_1b0,
              (Vector<double,_3U> *)
              ((long)(((this->refCoords_).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_ +
              lVar4),dVar8);
    Vector<double,_3U>::add(&local_168,(Vector<double,_3U> *)&local_1b0);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x18;
  }
  operator/((Vector<double,_3U> *)&local_1b0,&local_168,(this->super_StuntDouble).mass_);
  Vector3<double>::operator=(&this->refCOM_,(Vector<double,_3U> *)&local_1b0);
  lVar4 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->atoms_).
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->atoms_).
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    Vector<double,_3U>::sub
              ((Vector<double,_3U> *)
               ((long)(((this->refCoords_).
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_
               + lVar4),&(this->refCOM_).super_Vector<double,_3U>);
    lVar4 = lVar4 + 0x18;
  }
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_1b0,0.0);
  lVar6 = 0;
  lVar4 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->atoms_).
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->atoms_).
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    RectMatrix<double,_3U,_3U>::RectMatrix(&local_1f8,0.0);
    dVar8 = ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5]->super_StuntDouble).mass_;
    v1 = (Vector3<double> *)
         ((long)(((this->refCoords_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_ +
         lVar6);
    outProduct<double>((SquareMatrix3<double> *)&local_c0,v1,v1);
    operator*(&local_78,&local_c0,dVar8);
    RectMatrix<double,_3U,_3U>::sub(&local_1f8,&local_78);
    dVar7 = Vector<double,_3U>::lengthSquare
                      ((Vector<double,_3U> *)
                       ((long)(((this->refCoords_).
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>
                              ).data_ + lVar6));
    dVar8 = dVar8 * dVar7;
    local_1f8.data_[0][0] = local_1f8.data_[0][0] + dVar8;
    local_1f8.data_[1][1] = local_1f8.data_[1][1] + dVar8;
    local_1f8.data_[2][2] = dVar8 + local_1f8.data_[2][2];
    RectMatrix<double,_3U,_3U>::add(&local_1b0,&local_1f8);
    bVar2 = Atom::isDirectional((this->atoms_).
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar5]);
    if (bVar2) {
      SquareMatrix3<double>::transpose
                (&local_150,
                 (SquareMatrix3<double> *)
                 ((long)(((this->refOrients_).
                          super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_SquareMatrix<double,_3>)
                        .super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4));
      (*((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5]->super_StuntDouble)._vptr_StuntDouble[5])
                (&local_108);
      operator*((SquareMatrix3<double> *)&local_c0,&local_150,&local_108);
      operator*((SquareMatrix3<double> *)&local_78,(SquareMatrix3<double> *)&local_c0,
                (SquareMatrix3<double> *)
                ((long)(((this->refOrients_).
                         super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_SquareMatrix<double,_3>).
                       super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4));
      RectMatrix<double,_3U,_3U>::add(&local_1b0,&local_78);
    }
    lVar4 = lVar4 + 0x48;
    lVar6 = lVar6 + 0x18;
  }
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1f8);
  SquareMatrix3<double>::diagonalize
            ((SquareMatrix3<double> *)&local_1b0,(Vector3<double> *)&local_1f8,&this->sU_);
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
       = local_1f8.data_[0][0];
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
       = local_1f8.data_[0][1];
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]
       = local_1f8.data_[0][2];
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    if (ABS(local_1f8.data_[0][lVar4]) < 1e-06) {
      (this->super_StuntDouble).linear_ = true;
      (this->super_StuntDouble).linearAxis_ = (int)lVar4;
      iVar3 = iVar3 + 1;
    }
  }
  if (1 < iVar3) {
    memcpy(&painCave,
           "RigidBody error.\n\tOpenMD found more than one axis in this rigid body with a vanishing \n\tmoment of inertia.  This can happen in one of three ways:\n\t 1) Only one atom was specified, or \n\t 2) All atoms were specified at the same location, or\n\t 3) The programmers did something stupid.\n\tIt is silly to use a rigid body to describe this situation.  Be smarter.\n"
           ,0x165);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void RigidBody::calcRefCoords() {
    RealType mtmp;
    Vector3d refCOM(0.0);
    mass_ = 0.0;
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      mtmp = atoms_[i]->getMass();
      mass_ += mtmp;
      refCOM += refCoords_[i] * mtmp;
    }
    refCOM_ = refCOM / mass_;

    // Next, move the origin of the reference coordinate system to the COM:
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      refCoords_[i] -= refCOM_;
    }

    // Moment of Inertia calculation
    Mat3x3d Itmp(0.0);
    for (std::size_t i = 0; i < atoms_.size(); i++) {
      Mat3x3d IAtom(0.0);
      mtmp = atoms_[i]->getMass();
      IAtom -= outProduct(refCoords_[i], refCoords_[i]) * mtmp;
      RealType r2 = refCoords_[i].lengthSquare();
      IAtom(0, 0) += mtmp * r2;
      IAtom(1, 1) += mtmp * r2;
      IAtom(2, 2) += mtmp * r2;
      Itmp += IAtom;

      // project the inertial moment of directional atoms into this rigid body
      if (atoms_[i]->isDirectional()) {
        Itmp += refOrients_[i].transpose() * atoms_[i]->getI() * refOrients_[i];
      }
    }

    // diagonalize
    Vector3d evals;
    Mat3x3d::diagonalize(Itmp, evals, sU_);

    // zero out I and then fill the diagonals with the moments of inertia:
    inertiaTensor_(0, 0) = evals[0];
    inertiaTensor_(1, 1) = evals[1];
    inertiaTensor_(2, 2) = evals[2];

    int nLinearAxis = 0;
    for (int i = 0; i < 3; i++) {
      if (fabs(evals[i]) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "RigidBody error.\n"
          "\tOpenMD found more than one axis in this rigid body with a "
          "vanishing \n"
          "\tmoment of inertia.  This can happen in one of three ways:\n"
          "\t 1) Only one atom was specified, or \n"
          "\t 2) All atoms were specified at the same location, or\n"
          "\t 3) The programmers did something stupid.\n"
          "\tIt is silly to use a rigid body to describe this situation.  Be "
          "smarter.\n");
      painCave.isFatal = 1;
      simError();
    }
  }